

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O1

void __thiscall
Assimp::SGSpatialSort::FindPositions
          (SGSpatialSort *this,aiVector3D *pPosition,uint32_t pSG,float pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults,bool exactMatch)

{
  pointer *ppuVar1;
  float fVar2;
  pointer puVar3;
  pointer pEVar4;
  iterator iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  ulong uVar12;
  pointer pEVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar16 = pPosition->x;
  fVar18 = pPosition->y;
  fVar14 = (this->mPlaneNormal).y;
  fVar15 = (this->mPlaneNormal).x;
  fVar17 = pPosition->z;
  fVar2 = (this->mPlaneNormal).z;
  puVar3 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pEVar13 = (this->mPositions).
            super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->mPositions).
           super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar13 != pEVar4) {
    fVar16 = fVar17 * fVar2 + fVar16 * fVar15 + fVar18 * fVar14;
    fVar18 = fVar16 + pRadius;
    if ((pEVar13->mDistance <= fVar18) &&
       (fVar16 = fVar16 - pRadius, fVar16 < pEVar4[-1].mDistance || fVar16 == pEVar4[-1].mDistance))
    {
      uVar6 = ((long)pEVar4 - (long)pEVar13 >> 3) * -0x5555555555555555;
      uVar8 = uVar6 >> 1 & 0x7fffffff;
      if (7 < (uint)uVar6) {
        uVar12 = uVar6 >> 2 & 0x3fffffff;
        uVar9 = uVar8;
        do {
          uVar11 = (uint)uVar12;
          uVar7 = uVar11;
          if (fVar16 < pEVar13[uVar9].mDistance || fVar16 == pEVar13[uVar9].mDistance) {
            uVar7 = -uVar11;
          }
          uVar7 = uVar7 + (int)uVar9;
          uVar8 = (ulong)uVar7;
          uVar12 = uVar12 >> 1;
          uVar9 = (ulong)uVar7;
        } while (3 < uVar11);
      }
      uVar7 = (uint)uVar8;
      if (uVar7 != 0) {
        pfVar10 = &pEVar13[uVar8].mDistance;
        do {
          uVar7 = (uint)uVar8;
          if (*pfVar10 <= fVar16) goto LAB_00690ed5;
          uVar8 = uVar8 - 1;
          pfVar10 = pfVar10 + -6;
        } while ((int)uVar8 != 0);
        uVar7 = 0;
      }
LAB_00690ed5:
      do {
        uVar8 = (ulong)uVar7;
        if (uVar6 - 1 <= uVar8) break;
        uVar7 = uVar7 + 1;
      } while (pEVar13[uVar8].mDistance <= fVar16 && fVar16 != pEVar13[uVar8].mDistance);
      fVar16 = pRadius * pRadius;
      pEVar13 = pEVar13 + uVar8;
      if (exactMatch) {
        do {
          if (fVar18 < pEVar13->mDistance || fVar18 == pEVar13->mDistance) {
            return;
          }
          fVar17 = (pEVar13->mPosition).x - pPosition->x;
          fVar14 = (pEVar13->mPosition).y - pPosition->y;
          fVar15 = (pEVar13->mPosition).z - pPosition->z;
          if ((fVar15 * fVar15 + fVar17 * fVar17 + fVar14 * fVar14 < fVar16) &&
             (pEVar13->mSmoothGroups == pSG)) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar13->mIndex);
            }
            else {
              *iVar5._M_current = pEVar13->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar13 = pEVar13 + 1;
        } while (pEVar13 != pEVar4);
      }
      else if (pSG == 0) {
        do {
          if (fVar18 < pEVar13->mDistance || fVar18 == pEVar13->mDistance) {
            return;
          }
          fVar17 = (pEVar13->mPosition).x - pPosition->x;
          fVar14 = (pEVar13->mPosition).y - pPosition->y;
          fVar15 = (pEVar13->mPosition).z - pPosition->z;
          if (fVar15 * fVar15 + fVar17 * fVar17 + fVar14 * fVar14 < fVar16) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar13->mIndex);
            }
            else {
              *iVar5._M_current = pEVar13->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar13 = pEVar13 + 1;
        } while (pEVar13 != pEVar4);
      }
      else {
        do {
          if (fVar18 < pEVar13->mDistance || fVar18 == pEVar13->mDistance) {
            return;
          }
          fVar17 = (pEVar13->mPosition).x - pPosition->x;
          fVar14 = (pEVar13->mPosition).y - pPosition->y;
          fVar15 = (pEVar13->mPosition).z - pPosition->z;
          if ((fVar15 * fVar15 + fVar17 * fVar17 + fVar14 * fVar14 < fVar16) &&
             (pEVar13->mSmoothGroups == 0 || (pEVar13->mSmoothGroups & pSG) != 0)) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar13->mIndex);
            }
            else {
              *iVar5._M_current = pEVar13->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar13 = pEVar13 + 1;
        } while (pEVar13 != pEVar4);
      }
    }
  }
  return;
}

Assistant:

void SGSpatialSort::FindPositions( const aiVector3D& pPosition,
    uint32_t pSG,
    float pRadius,
    std::vector<unsigned int>& poResults,
    bool exactMatch /*= false*/) const
{
    float dist = pPosition * mPlaneNormal;
    float minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.empty() )
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray

    float squareEpsilon = pRadius * pRadius;
    std::vector<Entry>::const_iterator it  = mPositions.begin() + index;
    std::vector<Entry>::const_iterator end = mPositions.end();

    if (exactMatch)
    {
        while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon && it->mSmoothGroups == pSG)
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it )break;
        }
    }
    else
    {
        // if the given smoothing group is 0, we'll return all surrounding vertices
        if (!pSG)
        {
            while( it->mDistance < maxDist)
            {
                if((it->mPosition - pPosition).SquareLength() < squareEpsilon)
                    poResults.push_back( it->mIndex);
                ++it;
                if( end == it)break;
            }
        }
        else while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon &&
                (it->mSmoothGroups & pSG || !it->mSmoothGroups))
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it)break;
        }
    }
}